

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseCallOffset(State *state)

{
  bool bVar1;
  State *in_RDI;
  State copy;
  undefined1 local_40 [40];
  State *in_stack_ffffffffffffffe8;
  bool local_1;
  
  memcpy(local_40,in_RDI,0x30);
  bVar1 = ParseOneCharToken(in_RDI,'h');
  if (((bVar1) && (bVar1 = ParseNVOffset((State *)0x131a3c), bVar1)) &&
     (bVar1 = ParseOneCharToken(in_RDI,'_'), bVar1)) {
    local_1 = true;
  }
  else {
    memcpy(in_RDI,local_40,0x30);
    bVar1 = ParseOneCharToken(in_RDI,'v');
    if (((bVar1) && (bVar1 = ParseVOffset(in_stack_ffffffffffffffe8), bVar1)) &&
       (bVar1 = ParseOneCharToken(in_RDI,'_'), bVar1)) {
      local_1 = true;
    }
    else {
      memcpy(in_RDI,local_40,0x30);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool ParseCallOffset(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'h') &&
      ParseNVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'v') &&
      ParseVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  return false;
}